

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O0

void App::execute(int argc,char **argv)

{
  ostream *poVar1;
  size_type sVar2;
  runtime_error *this;
  vector<Config::Size,_std::allocator<Config::Size>_> *pages_00;
  undefined1 local_1c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileNames;
  vector<Config::Size,_std::allocator<Config::Size>_> pages;
  Glyphs glyphs;
  Font font;
  Library local_f0;
  Library library;
  Config config;
  char **argv_local;
  int argc_local;
  
  config._200_8_ = argv;
  ProgramOptions::parseCommandLine((Config *)&library,argc,argv);
  ft::Library::Library(&local_f0);
  if ((config.maxTextureCount._1_1_ & 1) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"freetype ");
    ft::Library::getVersionString_abi_cxx11_((string *)&font.glyph_overhang,&local_f0);
    poVar1 = std::operator<<(poVar1,(string *)&font.glyph_overhang);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&font.glyph_overhang);
  }
  pages_00 = (vector<Config::Size,_std::allocator<Config::Size>_> *)
             (ulong)((byte)config.kerningPairs._1_1_ & 1);
  ft::Font::Font((Font *)&glyphs._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_f0,
                 (string *)&library,(uint)(ushort)config.color._0_2_,0,
                 SUB41((byte)config.kerningPairs._1_1_ & 1,0));
  collectGlyphInfo((Glyphs *)
                   &pages.super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (Font *)&glyphs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   ((long)&config.fontFile.field_2 + 8));
  arrangeGlyphs((vector<Config::Size,_std::allocator<Config::Size>_> *)
                &fileNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                (Glyphs *)
                &pages.super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(Config *)&library);
  if (((undefined1)config.kerningPairs & Basic) != Disabled) {
    sVar2 = std::vector<Config::Size,_std::allocator<Config::Size>_>::size
                      ((vector<Config::Size,_std::allocator<Config::Size>_> *)
                       &fileNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (config.dataFormat < sVar2) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,"too many generated textures (more than --max-texture-count)");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  renderTextures_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1c8,
             (App *)&pages.super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(Glyphs *)&library,
             (Config *)&glyphs._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (Font *)&fileNames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,pages_00);
  writeFontInfoFile((Glyphs *)
                    &pages.super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(Config *)&library,
                    (Font *)&glyphs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1c8,
                    (vector<Config::Size,_std::allocator<Config::Size>_> *)
                    &fileNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c8);
  std::vector<Config::Size,_std::allocator<Config::Size>_>::~vector
            ((vector<Config::Size,_std::allocator<Config::Size>_> *)
             &fileNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
  ::~map((map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
          *)&pages.super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  ft::Font::~Font((Font *)&glyphs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ft::Library::~Library(&local_f0);
  Config::~Config((Config *)&library);
  return;
}

Assistant:

void App::execute(const int argc, char* argv[])
{
    const auto config = ProgramOptions::parseCommandLine(argc, argv);

    ft::Library library;
    if (config.verbose)
        std::cout << "freetype " << library.getVersionString() << "\n";

    ft::Font font(library, config.fontFile, config.fontSize, 0, config.monochrome);

    auto glyphs = collectGlyphInfo(font, config.chars);
    const auto pages = arrangeGlyphs(glyphs, config);
    if (config.useMaxTextureCount && pages.size() > config.maxTextureCount)
        throw std::runtime_error("too many generated textures (more than --max-texture-count)");

    const auto fileNames = renderTextures(glyphs, config, font, pages);
    writeFontInfoFile(glyphs, config, font, fileNames, pages);
}